

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::transform(btSoftBody *this,btTransform *trs)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  Node *pNVar9;
  long lVar10;
  long lVar11;
  float extraout_XMM0_Da;
  float fVar12;
  float fVar13;
  float fVar14;
  btDbvtVolume local_50;
  
  (*((this->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])();
  lVar10 = (long)(this->m_nodes).m_size;
  if (0 < lVar10) {
    lVar11 = 0;
    do {
      pNVar9 = (this->m_nodes).m_data;
      fVar1 = *(float *)((long)(pNVar9->m_x).m_floats + lVar11);
      fVar2 = *(float *)((long)(pNVar9->m_x).m_floats + lVar11 + 4);
      fVar3 = *(float *)((long)(pNVar9->m_x).m_floats + lVar11 + 8);
      uVar8 = *(undefined8 *)(trs->m_origin).m_floats;
      fVar13 = (float)uVar8 +
               (trs->m_basis).m_el[0].m_floats[2] * fVar3 +
               (trs->m_basis).m_el[0].m_floats[0] * fVar1 +
               (trs->m_basis).m_el[0].m_floats[1] * fVar2;
      fVar14 = (float)((ulong)uVar8 >> 0x20) +
               (trs->m_basis).m_el[1].m_floats[2] * fVar3 +
               (trs->m_basis).m_el[1].m_floats[0] * fVar1 +
               (trs->m_basis).m_el[1].m_floats[1] * fVar2;
      fVar12 = (trs->m_basis).m_el[2].m_floats[2] * fVar3 +
               (trs->m_basis).m_el[2].m_floats[0] * fVar1 +
               (trs->m_basis).m_el[2].m_floats[1] * fVar2 + (trs->m_origin).m_floats[2];
      *(ulong *)((long)(pNVar9->m_x).m_floats + lVar11) = CONCAT44(fVar14,fVar13);
      *(ulong *)((long)(pNVar9->m_x).m_floats + lVar11 + 8) = (ulong)(uint)fVar12;
      fVar1 = *(float *)((long)(pNVar9->m_q).m_floats + lVar11);
      fVar2 = *(float *)((long)(pNVar9->m_q).m_floats + lVar11 + 4);
      fVar3 = *(float *)((long)(pNVar9->m_q).m_floats + lVar11 + 8);
      fVar4 = (trs->m_basis).m_el[2].m_floats[1];
      fVar5 = (trs->m_basis).m_el[2].m_floats[0];
      fVar6 = (trs->m_basis).m_el[2].m_floats[2];
      uVar8 = *(undefined8 *)(trs->m_origin).m_floats;
      fVar7 = (trs->m_origin).m_floats[2];
      *(ulong *)((long)(pNVar9->m_q).m_floats + lVar11) =
           CONCAT44((float)((ulong)uVar8 >> 0x20) +
                    (trs->m_basis).m_el[1].m_floats[2] * fVar3 +
                    (trs->m_basis).m_el[1].m_floats[0] * fVar1 +
                    (trs->m_basis).m_el[1].m_floats[1] * fVar2,
                    (float)uVar8 +
                    (trs->m_basis).m_el[0].m_floats[2] * fVar3 +
                    (trs->m_basis).m_el[0].m_floats[0] * fVar1 +
                    (trs->m_basis).m_el[0].m_floats[1] * fVar2);
      *(ulong *)((long)(pNVar9->m_q).m_floats + lVar11 + 8) =
           (ulong)(uint)(fVar6 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2 + fVar7);
      fVar1 = *(float *)((long)(pNVar9->m_n).m_floats + lVar11);
      fVar2 = *(float *)((long)(pNVar9->m_n).m_floats + lVar11 + 4);
      fVar3 = *(float *)((long)(pNVar9->m_n).m_floats + lVar11 + 8);
      fVar4 = (trs->m_basis).m_el[2].m_floats[1];
      fVar5 = (trs->m_basis).m_el[2].m_floats[0];
      fVar6 = (trs->m_basis).m_el[2].m_floats[2];
      *(ulong *)((long)(pNVar9->m_n).m_floats + lVar11) =
           CONCAT44(fVar3 * (trs->m_basis).m_el[1].m_floats[2] +
                    fVar1 * (trs->m_basis).m_el[1].m_floats[0] +
                    (trs->m_basis).m_el[1].m_floats[1] * fVar2,
                    fVar3 * (trs->m_basis).m_el[0].m_floats[2] +
                    fVar1 * (trs->m_basis).m_el[0].m_floats[0] +
                    (trs->m_basis).m_el[0].m_floats[1] * fVar2);
      *(ulong *)((long)(pNVar9->m_n).m_floats + lVar11 + 8) =
           (ulong)(uint)(fVar3 * fVar6 + fVar1 * fVar5 + fVar2 * fVar4);
      local_50.mi.m_floats[1] = fVar14 - extraout_XMM0_Da;
      local_50.mi.m_floats[0] = fVar13 - extraout_XMM0_Da;
      local_50.mi.m_floats[2] = fVar12 - extraout_XMM0_Da;
      local_50.mi.m_floats[3] = 0.0;
      local_50.mx.m_floats[1] = extraout_XMM0_Da + fVar14;
      local_50.mx.m_floats[0] = extraout_XMM0_Da + fVar13;
      local_50.mx.m_floats[2] = extraout_XMM0_Da + fVar12;
      local_50.mx.m_floats[3] = 0.0;
      btDbvt::update(&this->m_ndbvt,*(btDbvtNode **)((long)(&pNVar9->m_n + 1) + lVar11 + 8),
                     &local_50);
      lVar11 = lVar11 + 0x78;
    } while (lVar10 * 0x78 - lVar11 != 0);
  }
  updateNormals(this);
  updateBounds(this);
  updateConstants(this);
  uVar8 = *(undefined8 *)((trs->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_initialWorldTransform).m_basis.m_el[0].m_floats =
       *(undefined8 *)(trs->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_initialWorldTransform).m_basis.m_el[0].m_floats + 2) = uVar8;
  uVar8 = *(undefined8 *)((trs->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_initialWorldTransform).m_basis.m_el[1].m_floats =
       *(undefined8 *)(trs->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_initialWorldTransform).m_basis.m_el[1].m_floats + 2) = uVar8;
  uVar8 = *(undefined8 *)((trs->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_initialWorldTransform).m_basis.m_el[2].m_floats =
       *(undefined8 *)(trs->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_initialWorldTransform).m_basis.m_el[2].m_floats + 2) = uVar8;
  uVar8 = *(undefined8 *)((trs->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_initialWorldTransform).m_origin.m_floats =
       *(undefined8 *)(trs->m_origin).m_floats;
  *(undefined8 *)((this->m_initialWorldTransform).m_origin.m_floats + 2) = uVar8;
  return;
}

Assistant:

void			btSoftBody::transform(const btTransform& trs)
{
	const btScalar	margin=getCollisionShape()->getMargin();
	ATTRIBUTE_ALIGNED16(btDbvtVolume)	vol;
	
	for(int i=0,ni=m_nodes.size();i<ni;++i)
	{
		Node&	n=m_nodes[i];
		n.m_x=trs*n.m_x;
		n.m_q=trs*n.m_q;
		n.m_n=trs.getBasis()*n.m_n;
		vol = btDbvtVolume::FromCR(n.m_x,margin);
		
		m_ndbvt.update(n.m_leaf,vol);
	}
	updateNormals();
	updateBounds();
	updateConstants();
	m_initialWorldTransform = trs;
}